

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Fail
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,HRESULT error)

{
  bool isBody;
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  ParseError *this_00;
  undefined4 *puVar4;
  long lVar5;
  ulong uVar6;
  
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  isBody = this->inBody;
  uVar6 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0x7ffffffe < (long)uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar3) goto LAB_00ed6ac6;
    *puVar4 = 0;
  }
  if ((uVar6 & 0xffffffff) < (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb0,"(nextOffset >= this->m_cMultiUnits)",
                       "nextOffset >= this->m_cMultiUnits");
    if (!bVar3) goto LAB_00ed6ac6;
    *puVar4 = 0;
  }
  sVar2 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  lVar5 = (long)this->next - (long)this->input;
  if (this->next < this->input || 0x7ffffffe < lVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x37,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar3) {
LAB_00ed6ac6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ParseError::ParseError(this_00,isBody,(int)uVar6 - (int)sVar2,(CharCount)lVar5,error);
  __cxa_throw(this_00,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::Fail(HRESULT error)
    {
        throw ParseError(inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
    }